

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

void __thiscall fmt::v9::detail::bigint::square(bigint *this)

{
  uint *puVar1;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  int iVar7;
  int i;
  uint *puVar8;
  long lVar9;
  ulong uVar10;
  int j;
  long lVar11;
  ulong uVar12;
  bool bVar13;
  basic_memory_buffer<unsigned_int,_32UL,_std::allocator<unsigned_int>_> n;
  
  uVar12 = (this->bigits_).super_buffer<unsigned_int>.size_;
  iVar2 = (int)uVar12;
  basic_memory_buffer<unsigned_int,_32UL,_std::allocator<unsigned_int>_>::basic_memory_buffer
            (&n,&this->bigits_);
  buffer<unsigned_int>::try_resize((buffer<unsigned_int> *)this,(ulong)(uint)(iVar2 * 2));
  puVar1 = (this->bigits_).super_buffer<unsigned_int>.ptr_;
  uVar5 = 0;
  uVar6 = 0;
  if (0 < iVar2) {
    uVar6 = uVar12 & 0xffffffff;
  }
  uVar3 = 0;
  uVar4 = 0;
  for (; puVar8 = n.super_buffer<unsigned_int>.ptr_, uVar10 = uVar5, uVar5 != uVar6;
      uVar5 = uVar5 + 1) {
    for (; uVar10 != 0xffffffffffffffff; uVar10 = uVar10 - 1) {
      bVar13 = CARRY8(uVar3,(ulong)n.super_buffer<unsigned_int>.ptr_[uVar10 & 0xffffffff] *
                            (ulong)*puVar8);
      uVar3 = uVar3 + (ulong)n.super_buffer<unsigned_int>.ptr_[uVar10 & 0xffffffff] * (ulong)*puVar8
      ;
      uVar4 = uVar4 + bVar13;
      puVar8 = puVar8 + 1;
    }
    puVar1[uVar5] = (uint)uVar3;
    uVar3 = uVar3 >> 0x20 | uVar4 << 0x20;
    uVar4 = uVar4 >> 0x20;
  }
  puVar1 = (this->bigits_).super_buffer<unsigned_int>.ptr_;
  iVar7 = 1;
  for (; (int)uVar12 < iVar2 * 2; uVar12 = (ulong)((int)uVar12 + 1)) {
    lVar11 = (long)(iVar2 + -1);
    for (lVar9 = (long)iVar7; lVar9 < iVar2; lVar9 = lVar9 + 1) {
      puVar8 = n.super_buffer<unsigned_int>.ptr_ + lVar11;
      lVar11 = lVar11 + -1;
      bVar13 = CARRY8(uVar3,(ulong)*puVar8 * (ulong)n.super_buffer<unsigned_int>.ptr_[lVar9]);
      uVar3 = uVar3 + (ulong)*puVar8 * (ulong)n.super_buffer<unsigned_int>.ptr_[lVar9];
      uVar4 = uVar4 + bVar13;
    }
    puVar1[uVar12 & 0xffffffff] = (uint)uVar3;
    uVar3 = uVar3 >> 0x20 | uVar4 << 0x20;
    uVar4 = uVar4 >> 0x20;
    iVar7 = iVar7 + 1;
  }
  remove_leading_zeros(this);
  this->exp_ = this->exp_ << 1;
  basic_memory_buffer<unsigned_int,_32UL,_std::allocator<unsigned_int>_>::deallocate(&n);
  return;
}

Assistant:

FMT_CONSTEXPR20 void square() {
    int num_bigits = static_cast<int>(bigits_.size());
    int num_result_bigits = 2 * num_bigits;
    basic_memory_buffer<bigit, bigits_capacity> n(std::move(bigits_));
    bigits_.resize(to_unsigned(num_result_bigits));
    auto sum = uint128_t();
    for (int bigit_index = 0; bigit_index < num_bigits; ++bigit_index) {
      // Compute bigit at position bigit_index of the result by adding
      // cross-product terms n[i] * n[j] such that i + j == bigit_index.
      for (int i = 0, j = bigit_index; j >= 0; ++i, --j) {
        // Most terms are multiplied twice which can be optimized in the future.
        sum += static_cast<double_bigit>(n[i]) * n[j];
      }
      (*this)[bigit_index] = static_cast<bigit>(sum);
      sum >>= num_bits<bigit>();  // Compute the carry.
    }
    // Do the same for the top half.
    for (int bigit_index = num_bigits; bigit_index < num_result_bigits;
         ++bigit_index) {
      for (int j = num_bigits - 1, i = bigit_index - j; i < num_bigits;)
        sum += static_cast<double_bigit>(n[i++]) * n[j--];
      (*this)[bigit_index] = static_cast<bigit>(sum);
      sum >>= num_bits<bigit>();
    }
    remove_leading_zeros();
    exp_ *= 2;
  }